

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::SetReference(CEPlanet *this,CEPlanet *reference)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    if (*(long **)(in_RDI + 0x68) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x68) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  *(undefined8 *)(in_RDI + 0x68) = in_RSI;
  *(undefined8 *)(in_RDI + 0x80) = 0xc6293e5939a08cea;
  return;
}

Assistant:

void CEPlanet::SetReference(CEPlanet* reference)
{
    if (reference_ != nullptr) {
        // redirect and delete
        delete reference_;
        reference_ = nullptr;
    }
    
    reference_ = reference;

    // Reset cached date so that coordinates are recomputed
    cached_jd_ = -1.0e30;
}